

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O0

void __thiscall
cppcms::url_dispatcher::map_generic
          (url_dispatcher *this,string *method,regex *re,generic_handler *h)

{
  generic_handler *h_00;
  string *in_RSI;
  shared_ptr<cppcms::(anonymous_namespace)::option> *in_RDI;
  shared_ptr<cppcms::(anonymous_namespace)::option> opt;
  generic_option *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  generic_option *in_stack_ffffffffffffffb0;
  
  h_00 = (generic_handler *)operator_new(0x88);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  anon_unknown_0::generic_option::generic_option
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (regex *)CONCAT44(in_stack_ffffffffffffffa4,uVar1),h_00);
  uVar1 = uVar1 & 0xffffff;
  std::shared_ptr<cppcms::(anonymous_namespace)::option>::
  shared_ptr<cppcms::(anonymous_namespace)::generic_option,void>(in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  booster::hold_ptr<cppcms::url_dispatcher::_data>::operator->
            ((hold_ptr<cppcms::url_dispatcher::_data> *)in_RDI);
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back((vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
               *)CONCAT44(in_stack_ffffffffffffffa4,uVar1),(value_type *)h_00);
  std::shared_ptr<cppcms::(anonymous_namespace)::option>::~shared_ptr
            ((shared_ptr<cppcms::(anonymous_namespace)::option> *)0x3b3f20);
  return;
}

Assistant:

void url_dispatcher::map_generic(std::string const &method,booster::regex const &re,generic_handler const &h)
	{
		booster::shared_ptr<option> opt(new generic_option(method,re,h));
		d->options.push_back(opt);
	}